

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosDynamicBinder.cpp
# Opt level: O2

void __thiscall adios2::helper::DynamicBinder::DynamicBinder(DynamicBinder *this,string *libName)

{
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,(string *)libName);
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  DynamicBinder(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

DynamicBinder::DynamicBinder(std::string libName) : DynamicBinder(libName, "") {}